

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDepthStencilTests.cpp
# Opt level: O0

TestLog * deqp::gles3::Functional::DepthStencilCaseUtil::operator<<
                    (TestLog *log,DepthStencilParams *params)

{
  MessageBuilder *pMVar1;
  Enum<int,_2UL> EVar2;
  char *local_968;
  MessageBuilder local_960;
  char *local_7e0;
  GetNameFunc local_7d8;
  int local_7d0;
  Enum<int,_2UL> local_7c8;
  MessageBuilder local_7b8;
  char *local_638;
  MessageBuilder local_630;
  MessageBuilder local_4b0;
  MessageBuilder local_330;
  char *local_1b0 [3];
  MessageBuilder local_198;
  DepthStencilParams *local_18;
  DepthStencilParams *params_local;
  TestLog *log_local;
  
  local_18 = params;
  params_local = (DepthStencilParams *)log;
  tcu::TestLog::operator<<(&local_198,log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_198,(char (*) [15])"Stencil test: ");
  local_1b0[0] = "Rendered image with GL_SAMPLE_COVERAGE disabled";
  if ((local_18->stencilTestEnabled & 1U) != 0) {
    local_1b0[0] = "Rendered image with GL_SAMPLE_COVERAGE enabled";
  }
  local_1b0[0] = local_1b0[0] + 0x27;
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,local_1b0);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_198);
  if ((local_18->stencilTestEnabled & 1U) != 0) {
    tcu::TestLog::operator<<
              (&local_330,(TestLog *)params_local,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<(&local_330,(char (*) [27])"Front-face stencil state: ")
    ;
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_330);
    operator<<((TestLog *)params_local,local_18->stencil);
    tcu::TestLog::operator<<
              (&local_4b0,(TestLog *)params_local,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<(&local_4b0,(char (*) [26])"Back-face stencil state: ");
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4b0);
    operator<<((TestLog *)params_local,local_18->stencil + 1);
  }
  tcu::TestLog::operator<<
            (&local_630,(TestLog *)params_local,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_630,(char (*) [13])"Depth test: ");
  local_638 = "Rendered image with GL_SAMPLE_COVERAGE disabled";
  if ((local_18->depthTestEnabled & 1U) != 0) {
    local_638 = "Rendered image with GL_SAMPLE_COVERAGE enabled";
  }
  local_638 = local_638 + 0x27;
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_638);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_630);
  if ((local_18->depthTestEnabled & 1U) != 0) {
    tcu::TestLog::operator<<
              (&local_7b8,(TestLog *)params_local,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<(&local_7b8,(char (*) [10])"  func = ");
    EVar2 = glu::getCompareFuncStr(local_18->depthFunc);
    local_7d8 = EVar2.m_getName;
    local_7d0 = EVar2.m_value;
    local_7c8.m_getName = local_7d8;
    local_7c8.m_value = local_7d0;
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_7c8);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [18])"\n  depth value = ");
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_18->depth);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [17])"\n  write mask = ");
    local_7e0 = "false";
    if ((local_18->depthWriteMask & 1U) != 0) {
      local_7e0 = "true";
    }
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_7e0);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x12b9f11);
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_7b8);
  }
  tcu::TestLog::operator<<
            (&local_960,(TestLog *)params_local,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_960,(char (*) [15])"Triangles are ");
  local_968 = "back";
  if (local_18->visibleFace == FACETYPE_FRONT) {
    local_968 = "front";
  }
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_968);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [8])"-facing");
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_960);
  return (TestLog *)params_local;
}

Assistant:

tcu::TestLog& operator<< (tcu::TestLog& log, const DepthStencilParams& params)
{
	log << TestLog::Message << "Stencil test: " << (params.stencilTestEnabled ? "enabled" : "disabled") << TestLog::EndMessage;
	if (params.stencilTestEnabled)
	{
		log << TestLog::Message << "Front-face stencil state: " << TestLog::EndMessage;
		log << params.stencil[rr::FACETYPE_FRONT];

		log << TestLog::Message << "Back-face stencil state: " << TestLog::EndMessage;
		log << params.stencil[rr::FACETYPE_BACK];
	}

	log << TestLog::Message << "Depth test: " << (params.depthTestEnabled ? "enabled" : "disabled") << TestLog::EndMessage;
	if (params.depthTestEnabled)
	{
		log << TestLog::Message << "  func = " << glu::getCompareFuncStr(params.depthFunc) << "\n"
								   "  depth value = " << params.depth << "\n"
								   "  write mask = " << (params.depthWriteMask ? "true" : "false") << "\n"
			<< TestLog::EndMessage;
	}

	log << TestLog::Message << "Triangles are " << (params.visibleFace == rr::FACETYPE_FRONT ? "front" : "back") << "-facing" << TestLog::EndMessage;

	return log;
}